

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_uuid.cpp
# Opt level: O0

char * ON_UuidToString(ON_UUID *uuid,char *s)

{
  byte bVar1;
  char *pcVar2;
  int iVar3;
  endian eVar4;
  int *local_58;
  uint c;
  int local_34;
  char *pcStack_30;
  int i;
  char *p;
  uchar *b;
  char *s_local;
  ON_UUID *uuid_local;
  
  if (ON_UuidToString(ON_UUID_struct_const&,char*)::rho == '\0') {
    iVar3 = __cxa_guard_acquire(&ON_UuidToString(ON_UUID_struct_const&,char*)::rho);
    if (iVar3 != 0) {
      eVar4 = ON::Endian();
      if (eVar4 == big_endian) {
        local_58 = big_endian_rho;
      }
      else {
        local_58 = little_endian_rho;
      }
      ON_UuidToString::rho = local_58;
      __cxa_guard_release(&ON_UuidToString(ON_UUID_struct_const&,char*)::rho);
    }
  }
  if (s == (char *)0x0) {
    uuid_local = (ON_UUID *)0x0;
  }
  else {
    pcStack_30 = s;
    for (local_34 = 0; local_34 < 0x10; local_34 = local_34 + 1) {
      bVar1 = uuid->Data4[(long)ON_UuidToString::rho[local_34] + -8];
      *pcStack_30 = "0123456789abcdef"[bVar1 >> 4];
      pcStack_30[1] = "0123456789abcdef"[bVar1 & 0xf];
      pcVar2 = pcStack_30 + 2;
      if (ON_UuidToString::addhyphen[local_34] != 0) {
        pcStack_30[2] = '-';
        pcVar2 = pcStack_30 + 3;
      }
      pcStack_30 = pcVar2;
    }
    *pcStack_30 = '\0';
    uuid_local = (ON_UUID *)s;
  }
  return (char *)uuid_local;
}

Assistant:

char* ON_UuidToString( const ON_UUID& uuid, char* s)
{
  // s - [out]  The s[] char array must have length >= 37.  
  //            The returned char array will have a 36 
  //            character uuid in s[0..35] and a null in s[36].

  // NOTE WELL: 
  //   This code has to work on non-Windows OSs and on both big and
  //   little endian CPUs.  The result must satisfy
  //   uuid == ON_UuidFromString(ON_UuidToString(uuid,s))

  // 31 August 2005 Dale Lear
  //     Changed upper case to lower case so result is
  //     identical to the string returned by Windows' ::UuidToString().
  //static const char x[16] = {'0','1','2','3','4','5','6','7','8','9','A','B','C','D','E','F'};
  static const char x[16] = {'0','1','2','3','4','5','6','7','8','9','a','b','c','d','e','f'};
  static const int addhyphen[16] = {0,0,0,1, 0,1, 0,1, 0,1,  0, 0, 0, 0, 0, 0};
  const unsigned char* b = (const unsigned char*)&uuid;
  char* p;
  int i;
  
  static const int* rho = (ON::endian::big_endian == ON::Endian())
                        ? big_endian_rho 
                        : little_endian_rho;

  // 5 December 2002 Dale Lear:
  //   There is either a bug in Purify (likely) or perhaps a bug in the 
  //   way Microsoft compiles  c>>4 when c is an unsigned char.  In any
  //   case, changing c to an unsigned int makes purify happy and should
  //   work just as well.
  //
  //unsigned char c;

  unsigned int c;

  if ( !s )
    return 0;
  p = s;
  for ( i = 0; i < 16; i++ ) {
    c = b[rho[i]];
    *p++ = x[c>>4];  // purify gripes here if c is an unsigned char - the code runs fine.
    *p++ = x[c&0x0F];
    if ( addhyphen[i] )
      *p++ = '-';
  }
  *p = 0;

#if defined(ON_DEBUG)
  {
    ON_UUID u = ON_UuidFromString(s);
    if ( ON_UuidCompare(&u,&uuid) ) {
      ON_ERROR("ON_UuidToString() bug"); // <- breakpoint here
    }
  }
#endif

  return s;
}